

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O0

size_t bssl::dtls_seal_max_input_len(SSL *ssl,uint16_t epoch,size_t max_out)

{
  bool bVar1;
  DTLSWriteEpoch *pDVar2;
  size_t sVar3;
  pointer this;
  size_t header_len;
  DTLSWriteEpoch *write_epoch;
  size_t max_out_local;
  uint16_t epoch_local;
  SSL *ssl_local;
  
  pDVar2 = dtls_get_write_epoch(ssl,epoch);
  if (pDVar2 == (DTLSWriteEpoch *)0x0) {
    ssl_local = (SSL *)0x0;
  }
  else {
    sVar3 = dtls_record_header_write_len(ssl,epoch);
    if (sVar3 < max_out) {
      this = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                       (&pDVar2->aead);
      write_epoch = (DTLSWriteEpoch *)SSLAEADContext::MaxSealInputLen(this,max_out - sVar3);
      if ((write_epoch != (DTLSWriteEpoch *)0x0) &&
         (bVar1 = use_dtls13_record_header(ssl,epoch), bVar1)) {
        write_epoch = (DTLSWriteEpoch *)&write_epoch[-1].field_0x5f;
      }
      ssl_local = (SSL *)write_epoch;
    }
    else {
      ssl_local = (SSL *)0x0;
    }
  }
  return (size_t)ssl_local;
}

Assistant:

size_t dtls_seal_max_input_len(const SSL *ssl, uint16_t epoch, size_t max_out) {
  DTLSWriteEpoch *write_epoch = dtls_get_write_epoch(ssl, epoch);
  if (write_epoch == nullptr) {
    return 0;
  }
  size_t header_len = dtls_record_header_write_len(ssl, epoch);
  if (max_out <= header_len) {
    return 0;
  }
  max_out -= header_len;
  max_out = write_epoch->aead->MaxSealInputLen(max_out);
  if (max_out > 0 && use_dtls13_record_header(ssl, epoch)) {
    // Remove 1 byte for the encrypted record type.
    max_out--;
  }
  return max_out;
}